

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_58a0d::tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float>::gemm4xN<2>
          (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  block_q8_0 *pbVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  block_q5_0 *pbVar15;
  long lVar16;
  long lVar17;
  block_q5_0 *pbVar18;
  long lVar19;
  long lVar20;
  block_q5_0 *pbVar21;
  block_q5_0 *pbVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 in_ZMM3 [64];
  __m128i x;
  __m128i x_1;
  undefined1 auVar35 [16];
  __m128i x_2;
  __m128i x_3;
  undefined1 auVar36 [32];
  undefined4 uVar37;
  undefined1 auVar38 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM18 [64];
  __m256 Cv [2] [4];
  undefined1 local_180 [4];
  float afStack_17c [15];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  lVar14 = m - m0;
  lVar11 = lVar14 + 3;
  if (-1 < lVar14) {
    lVar11 = lVar14;
  }
  lVar14 = (n - n0) / 2;
  lVar17 = (lVar11 >> 2) * lVar14;
  lVar11 = (lVar17 + -1 + (long)this->nth) / (long)this->nth;
  lVar12 = this->ith * lVar11;
  lVar11 = lVar11 + lVar12;
  if (lVar17 <= lVar11) {
    lVar11 = lVar17;
  }
  if (lVar12 < lVar11) {
    pbVar21 = this->A;
    pbVar4 = this->B;
    auVar26 = vmovdqa64_avx512vl(_DAT_0016a9c0);
    auVar33._8_8_ = 0x7fbfdfeff7fbfdfe;
    auVar33._0_8_ = 0x7fbfdfeff7fbfdfe;
    auVar33._16_8_ = 0x7fbfdfeff7fbfdfe;
    auVar33._24_8_ = 0x7fbfdfeff7fbfdfe;
    auVar32._8_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar32._0_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar32._16_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar32._24_8_ = 0xf0f0f0f0f0f0f0f0;
    lVar17 = this->k;
    lVar5 = this->ldc;
    lVar6 = this->ldb;
    auVar23 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
    local_c0 = ZEXT1664(auVar23);
    auVar31 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
    lVar7 = this->lda;
    pfVar8 = this->C;
    do {
      local_100 = local_c0;
      local_140 = local_c0;
      _local_180 = local_c0;
      lVar1 = m0 + (lVar12 / lVar14) * 4;
      lVar16 = n0 + (lVar12 % lVar14) * 2;
      if (0 < lVar17) {
        pbVar15 = pbVar21 + (lVar1 + 3) * lVar7;
        pbVar22 = pbVar21 + (lVar1 + 1) * lVar7;
        pbVar18 = pbVar21 + (lVar1 + 2) * lVar7;
        pbVar21 = pbVar21 + lVar7 * lVar1;
        auVar25 = vpinsrw_avx(ZEXT216(pbVar21->d),(uint)pbVar22->d,1);
        auVar35 = vpsrlw_avx(*(undefined1 (*) [16])pbVar21->qs,4);
        auVar28._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * *(undefined1 (*) [16])pbVar21->qs;
        auVar28._16_16_ = ZEXT116(1) * auVar35;
        auVar25 = vpinsrw_avx(auVar25,(uint)pbVar18->d,2);
        auVar25 = vpinsrw_avx(auVar25,(uint)pbVar15->d,3);
        auVar27 = vpermb_avx512vl(auVar26,ZEXT432(*(uint *)pbVar21->qh));
        auVar27 = vpor_avx2(auVar27,auVar33);
        auVar25 = vcvtph2ps_f16c(auVar25);
        auVar27 = vpcmpeqb_avx2(auVar27,auVar31);
        auVar27 = vpternlogq_avx512vl(auVar27,auVar27,auVar27,0xf);
        auVar28 = vpternlogq_avx512vl(auVar27,auVar32,auVar28,0xe2);
        auVar35 = vpsrlw_avx(*(undefined1 (*) [16])pbVar22->qs,4);
        auVar29._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * *(undefined1 (*) [16])pbVar22->qs;
        auVar29._16_16_ = ZEXT116(1) * auVar35;
        auVar27 = vpermb_avx512vl(auVar26,ZEXT432(*(uint *)pbVar22->qh));
        auVar27 = vpor_avx2(auVar27,auVar33);
        auVar27 = vpcmpeqb_avx2(auVar27,auVar31);
        auVar27 = vpternlogq_avx512vl(auVar27,auVar27,auVar27,0xf);
        auVar29 = vpternlogq_avx512vl(auVar27,auVar32,auVar29,0xe2);
        auVar34 = vpsignb_avx2(auVar29,auVar29);
        auVar35 = vpsrlw_avx(*(undefined1 (*) [16])pbVar18->qs,4);
        auVar30._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * *(undefined1 (*) [16])pbVar18->qs;
        auVar30._16_16_ = ZEXT116(1) * auVar35;
        auVar27 = vpermb_avx512vl(auVar26,ZEXT432(*(uint *)pbVar18->qh));
        auVar27 = vpor_avx2(auVar27,auVar33);
        auVar27 = vpcmpeqb_avx2(auVar27,auVar31);
        auVar27 = vpternlogq_avx512vl(auVar27,auVar27,auVar27,0xf);
        auVar30 = vpternlogq_avx512vl(auVar27,auVar32,auVar30,0xe2);
        auVar27 = vpsignb_avx2(auVar30,auVar30);
        auVar35 = vpsrlw_avx(*(undefined1 (*) [16])pbVar15->qs,4);
        auVar36._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * *(undefined1 (*) [16])pbVar15->qs;
        auVar36._16_16_ = ZEXT116(1) * auVar35;
        auVar26 = vpermb_avx512vl(auVar26,ZEXT432(*(uint *)pbVar15->qh));
        auVar26 = vpor_avx2(auVar26,auVar33);
        auVar31 = vpcmpeqb_avx2(auVar26,auVar31);
        auVar31 = vpternlogq_avx512vl(auVar31,auVar31,auVar31,0xf);
        auVar32 = vpternlogq_avx512vl(auVar31,auVar32,auVar36,0xe2);
        auVar26 = vpsignb_avx2(auVar28,auVar28);
        vpsignb_avx2(auVar32,auVar32);
        auVar35 = vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        lVar16 = lVar16 * lVar6;
        auVar31 = *(undefined1 (*) [32])pbVar4[lVar16].qs;
        uVar37 = *(undefined4 *)(&ggml_table_f32_f16 + (ulong)pbVar4[lVar16].d * 4);
        auVar9._4_4_ = uVar37;
        auVar9._0_4_ = uVar37;
        auVar9._8_4_ = uVar37;
        auVar9._12_4_ = uVar37;
        auVar24 = vmulps_avx512vl(auVar25,auVar9);
        auVar33 = vpsignb_avx2(auVar31,auVar28);
        auVar26 = vpdpbusd_avx512_vnni(ZEXT1632(auVar35),auVar26,auVar33);
        auVar33 = vcvtdq2ps_avx512vl(auVar26);
        auVar25 = vpxord_avx512vl(auVar26._0_16_,auVar26._0_16_);
        uVar37 = auVar24._0_4_;
        auVar38._4_4_ = uVar37;
        auVar38._0_4_ = uVar37;
        auVar38._8_4_ = uVar37;
        auVar38._12_4_ = uVar37;
        auVar38._16_4_ = uVar37;
        auVar38._20_4_ = uVar37;
        auVar38._24_4_ = uVar37;
        auVar38._28_4_ = uVar37;
        _local_180 = ZEXT1632(auVar23);
        vfmadd213ps_fma(auVar33,auVar38,_local_180);
        auVar26 = vpsignb_avx2(auVar31,auVar29);
        auVar26 = vpdpbusd_avx512_vnni(ZEXT1632(auVar25),auVar34,auVar26);
        auVar33 = vcvtdq2ps_avx512vl(auVar26);
        auVar35 = vpxord_avx512vl(auVar26._0_16_,auVar26._0_16_);
        auVar25 = vmovshdup_avx(auVar24);
        auVar26._0_8_ = auVar25._0_8_;
        auVar26._8_8_ = auVar26._0_8_;
        auVar26._16_8_ = auVar26._0_8_;
        auVar26._24_8_ = auVar26._0_8_;
        vfmadd213ps_fma(auVar33,auVar26,(undefined1  [32])0x0);
        auVar25 = vshufps_avx(auVar24,auVar24,0xaa);
        auVar34._0_8_ = auVar25._0_8_;
        auVar34._8_8_ = auVar34._0_8_;
        auVar34._16_8_ = auVar34._0_8_;
        auVar34._24_8_ = auVar34._0_8_;
        auVar26 = vpsignb_avx2(auVar31,auVar30);
        vpsignb_avx2(auVar31,auVar32);
        auVar31 = vpdpbusd_avx512_vnni(ZEXT1632(auVar35),auVar27,auVar26);
        auVar31 = vcvtdq2ps_avx512vl(auVar31);
        local_140._0_32_ = ZEXT1632(auVar23);
        vfmadd213ps_fma(auVar31,auVar34,local_140._0_32_);
        vshufps_avx(auVar24,auVar24,0xff);
        halt_baddata();
      }
      lVar19 = 0;
      bVar10 = true;
      do {
        bVar13 = bVar10;
        lVar20 = 0;
        do {
          pfVar3 = (float *)(local_180 + lVar20 * 8 + lVar19 * 0x80 + 0x10);
          pfVar2 = (float *)(local_180 + lVar20 * 8 + lVar19 * 0x80);
          auVar35._0_4_ = *pfVar3 + *pfVar2;
          auVar35._4_4_ = pfVar3[1] + pfVar2[1];
          auVar35._8_4_ = pfVar3[2] + pfVar2[2];
          auVar35._12_4_ = pfVar3[3] + pfVar2[3];
          auVar25 = vshufpd_avx(auVar35,auVar35,1);
          auVar24._0_4_ = auVar35._0_4_ + auVar25._0_4_;
          auVar24._4_4_ = auVar35._4_4_ + auVar25._4_4_;
          auVar24._8_4_ = auVar35._8_4_ + auVar25._8_4_;
          auVar24._12_4_ = auVar35._12_4_ + auVar25._12_4_;
          auVar25 = vhaddps_avx(auVar24,auVar24);
          *(int *)((long)pfVar8 + lVar20 + (lVar19 + lVar16) * lVar5 * 4 + lVar1 * 4) =
               auVar25._0_4_;
          lVar20 = lVar20 + 4;
        } while (lVar20 != 0x10);
        lVar19 = 1;
        bVar10 = false;
      } while (bVar13);
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar11);
  }
  return;
}

Assistant:

NOINLINE void gemm4xN(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / 4;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * 4;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][4] = {};
            for (int64_t l = 0; l < k; ++l) {
                uint64_t a_delta = ((uint64_t)A[lda * (ii + 3) + l].d << 48) | ((uint64_t)A[lda * (ii + 2) + l].d << 32) | ((uint64_t)A[lda * (ii + 1) + l].d << 16) | (A[lda * (ii + 0) + l].d);
                // Convert delta values for four blocks to float values
                __m128 da = _mm_cvtph_ps(_mm_set_epi64x(0, a_delta));
                __m256i avec0 = load(A + lda * (ii + 0) + l);
                __m256i avec1 = load(A + lda * (ii + 1) + l);
                __m256i avec2 = load(A + lda * (ii + 2) + l);
                __m256i avec3 = load(A + lda * (ii + 3) + l);
                for (int64_t j = 0; j < RN; ++j) {
                        __m128 db = _mm_set1_ps(unhalf(B[ldb * (jj + j) + l].d));
                        // Computation of product of delta values for four blocks and replicate it across 256 bit lane
                        __m256 dvec =  _mm256_castps128_ps256(_mm_mul_ps(da, db));
                        dvec = _mm256_permute2f128_ps(dvec ,dvec, 0);
                        // Computation of dot product and multiplication with appropriate delta value products
                        Cv[j][0] = madd(_mm256_shuffle_ps(dvec, dvec, 0),
                                    updot(_mm256_sign_epi8(avec0, avec0),
                                          _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec0)),
                                    Cv[j][0]);
                        Cv[j][1] = madd(_mm256_shuffle_ps(dvec, dvec, 85),
                                    updot(_mm256_sign_epi8(avec1, avec1),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec1)),
                                    Cv[j][1]);
                        Cv[j][2] = madd(_mm256_shuffle_ps(dvec, dvec, 170),
                                    updot(_mm256_sign_epi8(avec2, avec2),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec2)),
                                    Cv[j][2]);
                        Cv[j][3] = madd(_mm256_shuffle_ps(dvec, dvec, 255),
                                    updot(_mm256_sign_epi8(avec3, avec3),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec3)),
                                    Cv[j][3]);
                }
            }

            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < 4; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }